

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void bc_trie_foreach(bc_trie_t *trie,bc_trie_foreach_func_t func,void *user_data)

{
  bc_string_t *str;
  
  if (((trie != (bc_trie_t *)0x0) && (func != (bc_trie_foreach_func_t)0x0)) &&
     (trie->root != (bc_trie_node_t *)0x0)) {
    str = (bc_string_t *)bc_malloc(0x18);
    str->str = (char *)0x0;
    str->len = 0;
    str->allocated_len = 0;
    bc_string_append_len(str,"",0);
    bc_trie_foreach_node(trie->root,str,func,user_data);
    free(str->str);
    free(str);
    return;
  }
  return;
}

Assistant:

void
bc_trie_foreach(bc_trie_t *trie, bc_trie_foreach_func_t func,
    void *user_data)
{
    if (trie == NULL || trie->root == NULL || func == NULL)
        return;

    bc_string_t *str = bc_string_new();
    bc_trie_foreach_node(trie->root, str, func, user_data);
    bc_string_free(str, true);
}